

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

lyxml_ns * lyxml_ns_get(ly_set *ns_set,char *prefix,size_t prefix_len)

{
  lyd_node *plVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint local_34;
  uint32_t u;
  lyxml_ns *ns;
  size_t prefix_len_local;
  char *prefix_local;
  ly_set *ns_set_local;
  
  if (ns_set->count != 0) {
    local_34 = ns_set->count;
    do {
      local_34 = local_34 - 1;
      plVar1 = (ns_set->field_2).dnodes[local_34];
      if ((prefix == (char *)0x0) || (prefix_len == 0)) {
        lVar3._0_4_ = plVar1->hash;
        lVar3._4_4_ = plVar1->flags;
        if (lVar3 == 0) {
          return (lyxml_ns *)plVar1;
        }
      }
      else {
        lVar2._0_4_ = plVar1->hash;
        lVar2._4_4_ = plVar1->flags;
        if ((lVar2 != 0) && (iVar4 = ly_strncmp(*(char **)plVar1,prefix,prefix_len), iVar4 == 0)) {
          return (lyxml_ns *)plVar1;
        }
      }
    } while (local_34 != 0);
  }
  return (lyxml_ns *)0x0;
}

Assistant:

const struct lyxml_ns *
lyxml_ns_get(const struct ly_set *ns_set, const char *prefix, size_t prefix_len)
{
    struct lyxml_ns *ns;
    uint32_t u;

    if (!ns_set->count) {
        return NULL;
    }

    u = ns_set->count;
    do {
        --u;
        ns = (struct lyxml_ns *)ns_set->objs[u];

        if (prefix && prefix_len) {
            if (ns->prefix && !ly_strncmp(ns->prefix, prefix, prefix_len)) {
                return ns;
            }
        } else if (!ns->prefix) {
            /* default namespace */
            return ns;
        }
    } while (u);

    return NULL;
}